

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O1

printable_vtable * __thiscall
printable_vtable::operator=(printable_vtable *this,printable_vtable *rhs)

{
  get_value_ptr_type p_Var1;
  undefined8 uVar2;
  _func_void *p_Var3;
  long lVar4;
  void *pvVar5;
  printable_vtable temp;
  printable_vtable local_38;
  
  local_38.vtable_._M_elems[2] = (rhs->vtable_)._M_elems[2];
  local_38.vtable_._M_elems[0] = (rhs->vtable_)._M_elems[0];
  local_38.vtable_._M_elems[1] = (rhs->vtable_)._M_elems[1];
  p_Var1 = rhs->get_value_ptr_;
  pvVar5 = rhs->value_;
  rhs->get_value_ptr_ = get_value_ptr<false>;
  lVar4 = 0;
  do {
    uVar2 = *(undefined8 *)((long)local_38.vtable_._M_elems + lVar4);
    *(undefined8 *)((long)local_38.vtable_._M_elems + lVar4) =
         *(undefined8 *)((long)(this->vtable_)._M_elems + lVar4);
    p_Var3 = local_38.vtable_._M_elems[1];
    *(undefined8 *)((long)(this->vtable_)._M_elems + lVar4) = uVar2;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  local_38.get_value_ptr_ = this->get_value_ptr_;
  this->get_value_ptr_ = p_Var1;
  local_38.value_ = this->value_;
  this->value_ = pvVar5;
  if (local_38.get_value_ptr_ == get_value_ptr<true>) {
    pvVar5 = get_value_ptr<true>(&local_38);
    (*p_Var3)(pvVar5);
  }
  return this;
}

Assistant:

printable_vtable & operator= (printable_vtable && rhs) noexcept
    {
        printable_vtable temp(std::move(rhs));
        std::swap(temp.vtable_, vtable_);
        std::swap(temp.get_value_ptr_, get_value_ptr_);
        std::swap(temp.value_, value_);
        return *this;
    }